

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  string *psVar6;
  char *pcVar7;
  cmSourceGroup *pcVar8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer ppcVar9;
  pointer ppcVar10;
  pointer ppcVar11;
  string source;
  string linkName2;
  string fullPath;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string linkName4;
  string local_188;
  pointer local_168;
  string local_160;
  string local_140;
  string local_120;
  cmExtraEclipseCDT4Generator *local_100;
  cmMakefile *local_f8;
  cmGeneratedFileStream *local_f0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_e8;
  string local_c8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_a8;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_90;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_78;
  string local_60;
  pointer local_40;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_100 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"[Targets]","");
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"virtual:/virtual","");
  AppendLinkedResource(fout,&local_c8,&local_160,VirtualFolder);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_100->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar9 = (pcVar2->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar9 !=
      (pcVar2->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_140.field_2;
    local_f0 = fout;
    do {
      local_f8 = (*ppcVar9)->Makefile;
      local_40 = ppcVar9;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_90,&(*ppcVar9)->GeneratorTargets);
      local_168 = local_90.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_38 = &local_f8->SourceGroups;
        do {
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          std::__cxx11::string::append((char *)&local_160);
          TVar5 = cmGeneratorTarget::GetType(*local_168);
          if (TVar5 < UTILITY) {
            cmGeneratorTarget::GetType(*local_168);
            std::__cxx11::string::append((char *)&local_160);
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(*local_168);
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)(psVar6->_M_dataplus)._M_p);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"virtual:/virtual","");
            AppendLinkedResource(fout,&local_160,&local_188,VirtualFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_100->GenerateLinkedResources != false) {
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&local_78,local_38)
              ;
              this_00 = *local_168;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_140._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_140,"CMAKE_BUILD_TYPE","");
              pcVar7 = cmMakefile::GetSafeDefinition(local_f8,&local_140);
              std::__cxx11::string::string((string *)&local_188,pcVar7,(allocator *)&local_60);
              cmGeneratorTarget::GetSourceFiles(this_00,&local_e8,&local_188);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              ppcVar10 = local_e8.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
                ppcVar10 = local_e8.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              }
              for (; pcVar8 = local_78.
                              super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                  ppcVar10 !=
                  local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish; ppcVar10 = ppcVar10 + 1) {
                psVar6 = cmSourceFile::GetFullPath(*ppcVar10,(string *)0x0);
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                pcVar3 = (psVar6->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_188,pcVar3,pcVar3 + psVar6->_M_string_length);
                pcVar8 = cmMakefile::FindSourceGroup(local_f8,local_188._M_dataplus._M_p,&local_78);
                cmSourceGroup::AssignSource(pcVar8,*ppcVar10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
              }
              for (; pcVar8 != local_78.
                               super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                               _M_impl.super__Vector_impl_data._M_finish; pcVar8 = pcVar8 + 1) {
                local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_188,local_160._M_dataplus._M_p,
                           local_160._M_dataplus._M_p + local_160._M_string_length);
                std::__cxx11::string::append((char *)&local_188);
                cmSourceGroup::GetFullName(pcVar8);
                std::__cxx11::string::append((char *)&local_188);
                local_140._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_140,"virtual:/virtual","");
                AppendLinkedResource(local_f0,&local_188,&local_140,VirtualFolder);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != paVar1) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
                __x = cmSourceGroup::GetSourceFiles(pcVar8);
                std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                          (&local_a8,__x);
                for (ppcVar11 = local_a8.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    ppcVar11 !=
                    local_a8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish; ppcVar11 = ppcVar11 + 1) {
                  psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar11);
                  pcVar3 = (psVar6->_M_dataplus)._M_p;
                  local_140._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_140,pcVar3,pcVar3 + psVar6->_M_string_length);
                  bVar4 = cmsys::SystemTools::FileIsDirectory(&local_140);
                  if (!bVar4) {
                    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_60,local_188._M_dataplus._M_p,
                               local_188._M_dataplus._M_p + local_188._M_string_length);
                    std::__cxx11::string::append((char *)&local_60);
                    cmsys::SystemTools::GetFilenameName(&local_120,&local_140);
                    std::__cxx11::string::_M_append
                              ((char *)&local_60,(ulong)local_120._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_dataplus._M_p != &local_120.field_2) {
                      operator_delete(local_120._M_dataplus._M_p,
                                      local_120.field_2._M_allocated_capacity + 1);
                    }
                    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_120,local_140._M_dataplus._M_p,
                               local_140._M_dataplus._M_p + local_140._M_string_length);
                    AppendLinkedResource(local_f0,&local_60,&local_120,LinkToFile);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_dataplus._M_p != &local_120.field_2) {
                      operator_delete(local_120._M_dataplus._M_p,
                                      local_120.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_60._M_dataplus._M_p != &local_60.field_2) {
                      operator_delete(local_60._M_dataplus._M_p,
                                      local_60.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != paVar1) {
                    operator_delete(local_140._M_dataplus._M_p,
                                    local_140.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_a8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a8.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a8.
                                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a8.
                                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
              }
              if (local_e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_e8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_78);
              fout = local_f0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          local_168 = local_168 + 1;
        } while (local_168 !=
                 local_90.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_90.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppcVar9 = local_40 + 1;
    } while (ppcVar9 !=
             (((local_100->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
             LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
        (*lgIt)->GetGeneratorTargets();

    for(std::vector<cmGeneratorTarget*>::const_iterator ti=targets.begin();
        ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          const char* prefix = ((*ti)->GetType()==cmState::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           this->GetEclipsePath(fullPath),
                                           LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}